

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O1

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::getFirstLinkName_abi_cxx11_
          (string *__return_storage_ptr__,SixAxisForceTorqueSensor *this)

{
  SixAxisForceTorqueSensorPrivateAttributes *pSVar1;
  pointer pcVar2;
  
  pSVar1 = this->pimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pSVar1->link1Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pSVar1->link1Name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string SixAxisForceTorqueSensor::getFirstLinkName() const
{
    return this->pimpl->link1Name;
}